

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Gia_Man_t * Acb_NtkDeriveMiterCnfInter(Gia_Man_t *p,int iTar,int nTars)

{
  int iVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Gia_Man_t *p_00;
  int local_2c;
  Gia_Man_t *pGStack_28;
  int v;
  Gia_Man_t *pCof;
  Gia_Man_t *pCof1;
  int nTars_local;
  int iTar_local;
  Gia_Man_t *p_local;
  
  pGStack_28 = Gia_ManDup(p);
  local_2c = 0;
  while( true ) {
    if (iTar <= local_2c) {
      iVar1 = Gia_ManCiNum(pGStack_28);
      pGVar3 = Gia_ManDupCofactorVar(pGStack_28,(iVar1 - nTars) + iTar,0);
      Gia_ManStop(pGStack_28);
      p_00 = Acb_NtkEcoSynthesize(pGVar3);
      Gia_ManStop(pGVar3);
      pGVar3 = Gia_ManDupRemovePis(p_00,nTars);
      Gia_ManStop(p_00);
      return pGVar3;
    }
    iVar1 = Gia_ManCiNum(pGStack_28);
    pGVar3 = Gia_ManDupUniv(pGStack_28,(iVar1 - nTars) + local_2c);
    iVar1 = Gia_ManCiNum(pGVar3);
    iVar2 = Gia_ManCiNum(pGStack_28);
    if (iVar1 != iVar2) break;
    Gia_ManStop(pGStack_28);
    pGStack_28 = Acb_NtkEcoSynthesize(pGVar3);
    Gia_ManStop(pGVar3);
    local_2c = local_2c + 1;
  }
  __assert_fail("Gia_ManCiNum(pCof) == Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                ,0x9a4,"Gia_Man_t *Acb_NtkDeriveMiterCnfInter(Gia_Man_t *, int, int)");
}

Assistant:

Gia_Man_t * Acb_NtkDeriveMiterCnfInter( Gia_Man_t * p, int iTar, int nTars )
{
    Gia_Man_t * pCof1, * pCof = Gia_ManDup( p ); int v;
    for ( v = 0; v < iTar; v++ )
    {
        pCof = Gia_ManDupUniv( p = pCof, Gia_ManCiNum(pCof) - nTars + v );
        assert( Gia_ManCiNum(pCof) == Gia_ManCiNum(p) );
        Gia_ManStop( p );

        pCof = Acb_NtkEcoSynthesize( p = pCof );
        Gia_ManStop( p );
    }
    pCof1 = Gia_ManDupCofactorVar( pCof, Gia_ManCiNum(pCof) - nTars + iTar, 0 );
    Gia_ManStop( pCof );

    pCof1 = Acb_NtkEcoSynthesize( p = pCof1 );
    Gia_ManStop( p );

    pCof1 = Gia_ManDupRemovePis( p = pCof1, nTars );
    Gia_ManStop( p );
    return pCof1;
}